

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O3

void tcptran_pipe_send(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nni_aio *pnVar2;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x600));
  _Var1 = nni_aio_start(aio,tcptran_pipe_send_cancel,arg);
  if (_Var1) {
    nni_list_append((nni_list *)((long)arg + 0x88),aio);
    pnVar2 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x88));
    if (pnVar2 == aio) {
      tcptran_pipe_send_start((tcptran_pipe *)arg);
    }
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
  return;
}

Assistant:

static void
tcptran_pipe_send(void *arg, nni_aio *aio)
{
	tcptran_pipe *p = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&p->mtx);
	if (!nni_aio_start(aio, tcptran_pipe_send_cancel, p)) {
		nni_mtx_unlock(&p->mtx);
		return;
	}
	nni_list_append(&p->sendq, aio);
	if (nni_list_first(&p->sendq) == aio) {
		tcptran_pipe_send_start(p);
	}
	nni_mtx_unlock(&p->mtx);
}